

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O1

bool_t gf2Create(qr_o *f,size_t *p,void *stack)

{
  size_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  bool_t bVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  code *pcVar12;
  ulong uVar13;
  size_t sVar14;
  
  uVar13 = p[1];
  bVar6 = 0;
  if (uVar13 != 0) {
    uVar2 = p[2];
    uVar3 = p[3];
    if (uVar2 == 0) {
      if (uVar3 != 0) {
        return 0;
      }
      uVar2 = *p;
      if (uVar2 - uVar13 < 0x40) {
        return 0;
      }
      if (uVar2 <= uVar13) {
        return 0;
      }
      if ((uVar2 & 7) == 0) {
        return 0;
      }
      uVar13 = uVar2 + 0x3f >> 6;
      f->n = uVar13;
      sVar14 = uVar13 + ((*p & 0x3f) == 0);
      f->no = *p + 7 >> 3;
      f->mod = (word *)(f + 1);
      wwSetZero((word *)(f + 1),sVar14);
      wwSetBit(f->mod,*p,1);
      wwSetBit(f->mod,p[1],1);
      wwSetBit(f->mod,0,1);
      f->unity = f->mod + sVar14;
      wwSetW(f->mod + sVar14,f->n,1);
      psVar1 = f->unity + f->n;
      f->params = psVar1;
      *psVar1 = *p;
      psVar1[1] = p[1];
      psVar1[2] = 0;
      psVar1[3] = 0;
      psVar1[4] = (ulong)((uint)*p & 0x3f);
      psVar1[5] = *p >> 6;
      psVar1[6] = (ulong)((int)*p - (int)p[1] & 0x3f);
      psVar1[7] = *p - p[1] >> 6;
      f->from = gf2From;
      f->to = gf2To;
      f->add = gf2Add3;
      f->sub = gf2Add3;
      f->neg = gf2Neg2;
      pcVar12 = gf2MulTrinomial1;
      if (psVar1[6] == 0) {
        pcVar12 = gf2MulTrinomial0;
      }
      f->mul = pcVar12;
      pcVar12 = gf2SqrTrinomial1;
      if (psVar1[6] == 0) {
        pcVar12 = gf2SqrTrinomial0;
      }
      lVar7 = 0xd0;
    }
    else {
      if (uVar3 == 0) {
        return 0;
      }
      if (0x3f < uVar13) {
        return 0;
      }
      uVar4 = *p;
      if (uVar4 - uVar13 < 0x40) {
        return 0;
      }
      if (uVar2 <= uVar3) {
        return 0;
      }
      if (uVar13 <= uVar2) {
        return 0;
      }
      if (uVar4 <= uVar13) {
        return 0;
      }
      uVar13 = uVar4 + 0x3f >> 6;
      f->n = uVar13;
      sVar14 = uVar13 + ((*p & 0x3f) == 0);
      f->no = *p + 7 >> 3;
      f->mod = (word *)(f + 1);
      wwSetZero((word *)(f + 1),sVar14);
      wwSetBit(f->mod,*p,1);
      wwSetBit(f->mod,p[1],1);
      wwSetBit(f->mod,p[2],1);
      wwSetBit(f->mod,p[3],1);
      wwSetBit(f->mod,0,1);
      f->unity = f->mod + sVar14;
      wwSetW(f->mod + sVar14,f->n,1);
      psVar1 = f->unity + f->n;
      f->params = psVar1;
      *psVar1 = *p;
      psVar1[1] = p[1];
      psVar1[2] = p[2];
      psVar1[3] = p[3];
      psVar1[4] = (ulong)((uint)*p & 0x3f);
      psVar1[5] = *p >> 6;
      psVar1[6] = (ulong)((int)*p - (int)p[1] & 0x3f);
      psVar1[7] = *p - p[1] >> 6;
      psVar1[8] = (ulong)((int)*p - (int)p[2] & 0x3f);
      psVar1[9] = *p - p[2] >> 6;
      psVar1[10] = (ulong)((int)*p - (int)p[3] & 0x3f);
      psVar1[0xb] = *p - p[3] >> 6;
      f->from = gf2From;
      f->to = gf2To;
      f->add = gf2Add3;
      f->sub = gf2Add3;
      f->neg = gf2Neg2;
      f->mul = gf2MulPentanomial;
      lVar7 = 0xf0;
      pcVar12 = gf2SqrPentanomial;
    }
    f->sqr = pcVar12;
    f->inv = gf2Inv;
    f->div = gf2Div;
    sVar5 = f->n;
    (f->hdr).keep = lVar7 + (sVar14 + sVar5) * 8;
    (f->hdr).p_count = 3;
    (f->hdr).o_count = 0;
    sVar8 = ppMul_deep(sVar5,sVar5);
    sVar9 = ppSqr_deep(f->n);
    sVar14 = f->n;
    sVar10 = ppInvMod_deep(sVar14 + 1);
    sVar5 = f->n;
    sVar11 = ppDivMod_deep(sVar5 + 1);
    sVar14 = utilMax(4,sVar8,sVar9,sVar10 + sVar14 * 8 + 8,sVar11 + sVar5 * 8 + 8);
    f->deep = sVar14;
    bVar6 = 1;
  }
  return bVar6;
}

Assistant:

bool_t gf2Create(qr_o* f, const size_t p[4], void* stack)
{
	ASSERT(memIsValid(f, sizeof(qr_o)));
	ASSERT(memIsValid(p, 4 * sizeof(size_t)));
	// нормальный базис?
	if (p[1] == 0)
	{
		// todo: реализовать
		return FALSE;
	}
	// трехчлен?
	else if (p[2] == 0)
	{
		gf2_trinom_st* t;
		size_t n1;
		// нарушены соглашения?
		if (p[3] != 0)
			return FALSE;
		// нарушены условия функции ppRedTrinomial?
		if (p[0] % 8 == 0 || p[1] >= p[0] || p[0] - p[1] < B_PER_W)
			return FALSE;
		// зафиксировать размерность
		f->n = W_OF_B(p[0]);
		n1 = f->n + (p[0] % B_PER_W == 0);
		f->no = O_OF_B(p[0]);
		// сформировать mod
		f->mod = (word*)f->descr;
		wwSetZero(f->mod, n1);
		wwSetBit(f->mod, p[0], 1);
		wwSetBit(f->mod, p[1], 1);
		wwSetBit(f->mod, 0, 1);
		// сформировать unity
		f->unity = f->mod + n1;
		wwSetW(f->unity, f->n, 1);
		// сформировать params
		f->params = (size_t*)(f->unity + f->n);
		t = (gf2_trinom_st*)f->params;
		t->m = p[0];
		t->k = p[1];
		t->l = t->l1 = 0;
		t->bm = p[0] % B_PER_W;
		t->wm = p[0] / B_PER_W;
		t->bk = (p[0] - p[1]) % B_PER_W;
		t->wk = (p[0] - p[1]) / B_PER_W;
		// настроить интерфейсы
		f->from = gf2From;
		f->to = gf2To;
		f->add = gf2Add3;
		f->sub = gf2Add3;
		f->neg = gf2Neg2;
		f->mul = t->bk == 0 ? gf2MulTrinomial0 : gf2MulTrinomial1;
		f->sqr = t->bk == 0 ? gf2SqrTrinomial0 : gf2SqrTrinomial1;
		f->inv = gf2Inv;
		f->div = gf2Div;
		// заголовок
		f->hdr.keep = sizeof(qr_o) + O_OF_W(n1 + f->n) + sizeof(gf2_trinom_st);
		f->hdr.p_count = 3;
		f->hdr.o_count = 0;
		// глубина стека
		if (t->bk == 0)
			f->deep = utilMax(4,
				gf2MulTrinomial0_deep(f->n),
				gf2SqrTrinomial0_deep(f->n),
				gf2Inv_deep(f->n),
				gf2Div_deep(f->n));
		else 
			f->deep = utilMax(4,
				gf2MulTrinomial1_deep(f->n),
				gf2SqrTrinomial1_deep(f->n),
				gf2Inv_deep(f->n),
				gf2Div_deep(f->n));
	}
	// пятичлен?
	else
	{
		gf2_pentanom_st* t;
		size_t n1;
		// нарушены соглашения?
		if (p[3] == 0)
			return FALSE;
		// нарушены условия функции ppRedPentanomial?
		if (p[1] >= p[0] || p[2] >= p[1] || p[3] >= p[2] || 
			p[0] - p[1] < B_PER_W || p[1] >= B_PER_W)
			return FALSE;
		// зафиксировать размерность
		f->n = W_OF_B(p[0]);
		n1 = f->n + (p[0] % B_PER_W == 0);
		f->no = O_OF_B(p[0]);
		// сформировать mod
		f->mod = (word*)f->descr;
		wwSetZero(f->mod, n1);
		wwSetBit(f->mod, p[0], 1);
		wwSetBit(f->mod, p[1], 1);
		wwSetBit(f->mod, p[2], 1);
		wwSetBit(f->mod, p[3], 1);
		wwSetBit(f->mod, 0, 1);
		// сформировать unity
		f->unity = f->mod + n1;
		wwSetW(f->unity, f->n, 1);
		// сформировать params
		f->params = (size_t*)(f->unity + f->n);
		t = (gf2_pentanom_st*)f->params;
		t->m = p[0];
		t->k = p[1];
		t->l = p[2];
		t->l1 = p[3];
		t->bm = p[0] % B_PER_W;
		t->wm = p[0] / B_PER_W;
		t->bk = (p[0] - p[1]) % B_PER_W;
		t->wk = (p[0] - p[1]) / B_PER_W;
		t->bl = (p[0] - p[2]) % B_PER_W;
		t->wl = (p[0] - p[2]) / B_PER_W;
		t->bl1 = (p[0] - p[3]) % B_PER_W;
		t->wl1 = (p[0] - p[3]) / B_PER_W;
		// настроить интерфейсы
		f->from = gf2From;
		f->to = gf2To;
		f->add = gf2Add3;
		f->sub = gf2Add3;
		f->neg = gf2Neg2;
		f->mul = gf2MulPentanomial;
		f->sqr = gf2SqrPentanomial;
		f->inv = gf2Inv;
		f->div = gf2Div;
		// заголовок
		f->hdr.keep = sizeof(qr_o) + O_OF_W(n1 + f->n) + 
			sizeof(gf2_pentanom_st);
		f->hdr.p_count = 3;
		f->hdr.o_count = 0;
		// глубина стека
		f->deep = utilMax(4,
			gf2MulPentanomial_deep(f->n),
			gf2SqrPentanomial_deep(f->n),
			gf2Inv_deep(f->n),
			gf2Div_deep(f->n));
	}
	return TRUE;
}